

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void printfFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *psVar1;
  undefined4 n;
  uchar *zFormat;
  char *z;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  int local_38;
  undefined4 local_34;
  sqlite3_value **local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  if (0 < argc) {
    psVar1 = context->pOut->db;
    zFormat = sqlite3_value_text(*argv);
    if (zFormat != (uchar *)0x0) {
      local_38 = argc + -1;
      local_34 = 0;
      local_30 = argv + 1;
      local_58._20_4_ = psVar1->aLimit[0];
      local_58._8_8_ = (char *)0x0;
      local_58._16_4_ = 0;
      local_58._24_6_ = 0x20000000000;
      local_58._0_8_ = psVar1;
      sqlite3_str_appendf((StrAccum *)local_58,(char *)zFormat);
      n = local_58._24_4_;
      z = sqlite3StrAccumFinish((StrAccum *)local_58);
      sqlite3_result_text(context,z,n,sqlite3OomClear);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void printfFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  PrintfArguments x;
  StrAccum str;
  const char *zFormat;
  int n;
  sqlite3 *db = sqlite3_context_db_handle(context);

  if( argc>=1 && (zFormat = (const char*)sqlite3_value_text(argv[0]))!=0 ){
    x.nArg = argc-1;
    x.nUsed = 0;
    x.apArg = argv+1;
    sqlite3StrAccumInit(&str, db, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
    str.printfFlags = SQLITE_PRINTF_SQLFUNC;
    sqlite3_str_appendf(&str, zFormat, &x);
    n = str.nChar;
    sqlite3_result_text(context, sqlite3StrAccumFinish(&str), n,
                        SQLITE_DYNAMIC);
  }
}